

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_options.c
# Opt level: O2

int archive_set_format_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  
  if ((char *)_a[1].read_data_output_offset == (char *)0x0) {
    iVar1 = (uint)(m != (char *)0x0) * 4 + -0x19;
  }
  else if ((m == (char *)0x0) ||
          (iVar1 = strcmp(m,(char *)_a[1].read_data_output_offset), iVar1 == 0)) {
    if (*(code **)&_a[1].read_data_is_posix_read != (code *)0x0) {
      iVar1 = (**(code **)&_a[1].read_data_is_posix_read)(_a,o,v);
      return iVar1;
    }
    iVar1 = -0x14;
  }
  else {
    iVar1 = -0x15;
  }
  return iVar1;
}

Assistant:

static int
archive_set_format_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_write *a = (struct archive_write *)_a;

	if (a->format_name == NULL)
		return (m == NULL)?ARCHIVE_FAILED:ARCHIVE_WARN - 1;
	/* If the format name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && strcmp(m, a->format_name) != 0)
		return (ARCHIVE_WARN - 1);
	if (a->format_options == NULL)
		return (ARCHIVE_WARN);
	return a->format_options(a, o, v);
}